

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O1

void * __thiscall
MemPlumberInternal::allocateMemory(MemPlumberInternal *this,size_t size,char *file,int line)

{
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 *puVar4;
  char *__format;
  ulong uVar5;
  
  iVar1 = this->m_ProgramStarted;
  if ((iVar1 != 0) && (this->m_Started == false)) {
    if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
      fwrite("Request for memory allocation before program started\n",0x35,1,(FILE *)this->m_Dumper)
      ;
    }
    pvVar3 = malloc(size);
    return pvVar3;
  }
  puVar2 = (undefined8 *)malloc(size + 0x78);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  if (puVar2 == (undefined8 *)0x0) {
    puVar4 = (undefined8 *)0x0;
  }
  else {
    puVar4 = puVar2 + 0xf;
    uVar5 = (ulong)((uint)((ulong)puVar4 >> 5) & 0x1fff8);
    *puVar2 = *(undefined8 *)
               ((long)this->m_PointerListHashtable + uVar5 + (ulong)(iVar1 == 0) * 0x20000);
    *(int *)((long)puVar2 + 0x6c) = line;
    puVar2[0xe] = size;
    strncpy((char *)(puVar2 + 1),file,99);
    *(undefined1 *)((long)puVar2 + 0x6b) = 0;
    *(undefined8 **)((long)this->m_PointerListHashtable + uVar5 + (ulong)(iVar1 == 0) * 0x20000) =
         puVar2;
    if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
      if (iVar1 == 0) {
        __format = "Allocate static variable: %d[bytes] in 0x%p in %s:%d\n";
      }
      else {
        __format = "Allocate: %d[bytes] in 0x%p in %s:%d\n";
      }
      fprintf((FILE *)this->m_Dumper,__format,size & 0xffffffff,puVar4,file,(ulong)(uint)line);
    }
  }
  return puVar4;
}

Assistant:

void* allocateMemory(std::size_t size, const char* file, int line) {

        // if not started, allocate memory and exit
        if (m_ProgramStarted != 0 && !m_Started) {
            if (isVerbose()) {
                fprintf(m_Dumper, "Request for memory allocation before program started\n");
            }
            return malloc(size);
        }

        // total memory to allocated is the requested size + metadata size
        size_t totalSizeToAllocate = size + sizeof(new_ptr_list_t);

        // allocated memory
        new_ptr_list_t* pointerMetaDataRecord = (new_ptr_list_t*)malloc(totalSizeToAllocate);
        memset(pointerMetaDataRecord, 0, sizeof(new_ptr_list_t));

        // if cannot allocate, return NULL
        if (pointerMetaDataRecord == NULL)
            return pointerMetaDataRecord;
        
        // calculate the actual pointer to provide to the user
        void* actualPointer = (char*)pointerMetaDataRecord + sizeof(new_ptr_list_t);

        // find the hash index for this pointer
        size_t hashIndex = MEMPLUMBER_HASH(actualPointer);

        new_ptr_list_t** hashtable = (m_ProgramStarted == 0 ? m_StaticPointerListHashtable : m_PointerListHashtable);

        // chain this metadata to the linked list of the specific bucket 
        pointerMetaDataRecord->next = hashtable[hashIndex];

        // fill in the metadata
        pointerMetaDataRecord->line = line;
        pointerMetaDataRecord->size = size;
        strncpy(pointerMetaDataRecord->file, file, MEMPLUMBER_FILENAME_LEN - 1);
		pointerMetaDataRecord->file[MEMPLUMBER_FILENAME_LEN - 1] = '\0';

        // put this metadata in the head of the list
        hashtable[hashIndex] = pointerMetaDataRecord;

        if (isVerbose()) {
            if (m_ProgramStarted == 0) {
                fprintf(m_Dumper, "Allocate static variable: %d[bytes] in 0x%p in %s:%d\n", (int)size, actualPointer, file, line);
            } else {
                fprintf(m_Dumper, "Allocate: %d[bytes] in 0x%p in %s:%d\n", (int)size, actualPointer, file, line);
            }
        }

        return actualPointer;
    }